

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_impl.h
# Opt level: O1

int secp256k1_ecmult_wnaf(int *wnaf,int len,secp256k1_scalar *a,int w)

{
  int iVar1;
  byte bVar2;
  int iVar3;
  uint uVar4;
  undefined4 in_register_00000034;
  uint64_t *puVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  bool bVar11;
  secp256k1_scalar s;
  secp256k1_scalar local_48;
  
  puVar5 = (uint64_t *)CONCAT44(in_register_00000034,len);
  uVar4 = 0;
  memset(wnaf,0,0x204);
  local_48.d[2] = puVar5[2];
  local_48.d[3] = puVar5[3];
  local_48.d[0] = *puVar5;
  local_48.d[1] = puVar5[1];
  iVar3 = 1;
  if ((long)puVar5[3] < 0) {
    secp256k1_scalar_negate(&local_48,&local_48);
    iVar3 = -1;
  }
  iVar1 = (int)a;
  uVar9 = 0xffffffff;
  uVar6 = 0;
  do {
    uVar10 = uVar6 >> 6;
    bVar2 = (byte)uVar6 & 0x3f;
    uVar8 = (uint)(local_48.d[uVar10] >> bVar2);
    if ((uVar8 & 1) == uVar4) {
      uVar8 = uVar6 + 1;
    }
    else {
      iVar7 = 0x81 - uVar6;
      if (iVar1 <= (int)(0x81 - uVar6)) {
        iVar7 = iVar1;
      }
      if ((uVar6 + iVar7) - 1 >> 6 != uVar10) {
        uVar8 = uVar8 | (uint)(local_48.d[(ulong)uVar10 + 1] << (-bVar2 & 0x3f));
      }
      uVar9 = ((uVar8 << (-(char)iVar7 & 0x1fU)) >> (-(char)iVar7 & 0x1fU)) + uVar4;
      bVar11 = (uVar9 >> (iVar1 - 1U & 0x1f) & 1) != 0;
      uVar4 = (uint)bVar11;
      wnaf[(int)uVar6] = (uVar9 - ((uint)bVar11 << ((byte)a & 0x1f))) * iVar3;
      uVar8 = iVar7 + uVar6;
      uVar9 = uVar6;
    }
    uVar6 = uVar8;
  } while ((int)uVar6 < 0x81);
  return uVar9 + 1;
}

Assistant:

static int secp256k1_ecmult_wnaf(int *wnaf, int len, const secp256k1_scalar *a, int w) {
    secp256k1_scalar s;
    int last_set_bit = -1;
    int bit = 0;
    int sign = 1;
    int carry = 0;

    VERIFY_CHECK(wnaf != NULL);
    VERIFY_CHECK(0 <= len && len <= 256);
    VERIFY_CHECK(a != NULL);
    VERIFY_CHECK(2 <= w && w <= 31);

    memset(wnaf, 0, len * sizeof(wnaf[0]));

    s = *a;
    if (secp256k1_scalar_get_bits_limb32(&s, 255, 1)) {
        secp256k1_scalar_negate(&s, &s);
        sign = -1;
    }

    while (bit < len) {
        int now;
        int word;
        if (secp256k1_scalar_get_bits_limb32(&s, bit, 1) == (unsigned int)carry) {
            bit++;
            continue;
        }

        now = w;
        if (now > len - bit) {
            now = len - bit;
        }

        word = secp256k1_scalar_get_bits_var(&s, bit, now) + carry;

        carry = (word >> (w-1)) & 1;
        word -= carry << w;

        wnaf[bit] = sign * word;
        last_set_bit = bit;

        bit += now;
    }
#ifdef VERIFY
    {
        int verify_bit = bit;

        VERIFY_CHECK(carry == 0);

        while (verify_bit < 256) {
            VERIFY_CHECK(secp256k1_scalar_get_bits_limb32(&s, verify_bit, 1) == 0);
            verify_bit++;
        }
    }
#endif
    return last_set_bit + 1;
}